

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase2::Run(BasicAtomicCase2 *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  int iVar1;
  bool bVar2;
  GLuint GVar3;
  ostream *poVar4;
  long lVar5;
  char *format;
  GLuint i;
  GLint blocksTCS;
  ostringstream reason;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d8,(GLint *)&local_208);
  iVar1 = (int)local_208._M_dataplus._M_p;
  if ((int)local_208._M_dataplus._M_p < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Required ",9);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a8,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," TCS storage blocks but only ",0x1d);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_208._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," available.",0xb);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if (iVar1 < 2) {
      return 0x10;
    }
  }
  bVar2 = ShaderStorageBufferObjectBase::SupportedInTES((ShaderStorageBufferObjectBase *)this,2);
  lVar5 = 0x10;
  if (bVar2) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,"");
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,
               "\nlayout(vertices = 1) out;\nlayout(std430, binding = 0) buffer TCSuint {\n  uint g_uint_out[1];\n};\nlayout(std430, binding = 1) buffer TCSint {\n  int data[1];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n  if (gl_InvocationID == 0) {\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n  }\n  if (atomicAdd(g_uint_out[gl_InvocationID], g_uint_value[0]) != 0u) return;\n  if (atomicExchange(g_uint_out[gl_InvocationID], g_uint_value[0]) != 3u) return;\n  if (atomicMin(g_uint_out[gl_InvocationID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_out[gl_InvocationID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_out[gl_InvocationID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_out[gl_InvocationID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_out[gl_InvocationID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_out[gl_InvocationID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_out[gl_InvocationID] = 1u;\n    return;\n  }\n\n  if (atomicAdd(g_int_out.data[gl_InvocationID], 3) != 0) return;\n  if (atomicExchange(g_int_out.data[gl_InvocationID], 3) != 3) return;\n  if (atomicMin(g_int_out.data[gl_InvocationID], 1) != 3) return;\n  if (atomicMax(g_int_out.data[gl_InvocationID], 2) != 1) return;\n  if (atomicAnd(g_int_out.data[gl_InvocationID], 0x1) != 2) return;\n  if (atomicOr(g_int_out.data[gl_InvocationID], 0x3) != 0) return;\n  if (atomicXor(g_int_out.data[gl_InvocationID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_out.data[gl_InvocationID], 0x2, 0x7) != 2) {\n    g_int_out.data[gl_InvocationID] = 1;\n    return;\n  }\n}"
               ,"");
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "\nlayout(quads, point_mode) in;\nlayout(std430, binding = 2) buffer TESuint {\n  uint data[1];\n} g_uint_tes;\nlayout(std430, binding = 3) buffer TESint {\n  int data[1];\n} g_int_tes;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n\n  if (atomicExchange(g_uint_tes.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_tes.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_tes.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_tes.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_tes.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_tes.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_tes.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_tes.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_tes.data[gl_PrimitiveID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_tes.data[gl_PrimitiveID], 1) != 0) return;\n  if (atomicAdd(g_int_tes.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicMin(g_int_tes.data[gl_PrimitiveID], 1) != 3) return;\n  if (atomicMax(g_int_tes.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicAnd(g_int_tes.data[gl_PrimitiveID], 0x1) != 2) return;\n  if (atomicOr(g_int_tes.data[gl_PrimitiveID], 0x3) != 0) return;\n  if (atomicXor(g_int_tes.data[gl_PrimitiveID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_tes.data[gl_PrimitiveID], 0x2, 0x7) != 2) {\n    g_int_tes.data[gl_PrimitiveID] = 1;\n    return;\n  }\n}"
               ,"");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,0x1b3c1e9);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,"");
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      ((ShaderStorageBufferObjectBase *)this,local_1a8,&local_228,&local_208,
                       &local_1c8,&local_1e8);
    *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glLinkProgram
              (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      ((ShaderStorageBufferObjectBase *)this,
                       *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    lVar5 = -1;
    if (bVar2) {
      buffers = (GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4);
      glu::CallLogWrapper::glGenBuffers(this_00,4,buffers);
      lVar5 = 0;
      do {
        local_1a8[0]._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p & 0xffffffff00000000;
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,(GLuint)lVar5,buffers[lVar5]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,local_1a8,0x88e8);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      lVar5 = 0;
      local_1a8[0]._M_dataplus._M_p = (pointer)0x0;
      glu::CallLogWrapper::glGenBuffers
                (this_00,1,(GLuint *)((this->super_ComputeShaderBase).g_color_eps.m_data + 2));
      glu::CallLogWrapper::glBindBuffer
                (this_00,0x8892,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,8,local_1a8,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glGenVertexArrays
                (this_00,1,(GLuint *)((this->super_ComputeShaderBase).g_color_eps.m_data + 1));
      glu::CallLogWrapper::glBindVertexArray
                (this_00,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[1]);
      glu::CallLogWrapper::glBindBuffer
                (this_00,0x8892,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[2]);
      glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glUseProgram
                (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      glu::CallLogWrapper::glBindVertexArray
                (this_00,(GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[1]);
      glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      bVar2 = true;
      do {
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x90d2,
                   (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[lVar5 * 2 + -3]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,local_1a8);
        if ((uint)local_1a8[0]._M_dataplus._M_p != 7) {
          format = "uData at index %d is %d should be %d.\n";
LAB_0096e829:
          anon_unknown_0::Output(format,0,(ulong)(uint)local_1a8[0]._M_dataplus._M_p,7);
          break;
        }
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x90d2,
                   (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[lVar5 * 2 + -2]);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,local_1a8);
        if ((uint)local_1a8[0]._M_dataplus._M_p != 7) {
          format = "iData at index %d is %d should be %d.\n";
          goto LAB_0096e829;
        }
        lVar5 = lVar5 + 1;
        bVar2 = lVar5 == 1;
      } while (bVar2);
      lVar5 = -(ulong)bVar2;
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInTCS(2))
			return NOT_SUPPORTED;
		if (!SupportedInTES(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_tcs = NL
			"layout(vertices = 1) out;" NL "layout(std430, binding = 0) buffer TCSuint {" NL "  uint g_uint_out[1];" NL
			"};" NL "layout(std430, binding = 1) buffer TCSint {" NL "  int data[1];" NL "} g_int_out;" NL
			"uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			"  gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;" NL
			"  if (gl_InvocationID == 0) {" NL "    gl_TessLevelInner[0] = 1.0;" NL "    gl_TessLevelInner[1] = 1.0;" NL
			"    gl_TessLevelOuter[0] = 1.0;" NL "    gl_TessLevelOuter[1] = 1.0;" NL
			"    gl_TessLevelOuter[2] = 1.0;" NL "    gl_TessLevelOuter[3] = 1.0;" NL "  }" NL
			"  if (atomicAdd(g_uint_out[gl_InvocationID], g_uint_value[0]) != 0u) return;" NL
			"  if (atomicExchange(g_uint_out[gl_InvocationID], g_uint_value[0]) != 3u) return;" NL
			"  if (atomicMin(g_uint_out[gl_InvocationID], g_uint_value[1]) != 3u) return;" NL
			"  if (atomicMax(g_uint_out[gl_InvocationID], g_uint_value[2]) != 1u) return;" NL
			"  if (atomicAnd(g_uint_out[gl_InvocationID], g_uint_value[3]) != 2u) return;" NL
			"  if (atomicOr(g_uint_out[gl_InvocationID], g_uint_value[4]) != 0u) return;" NL
			"  if (g_uint_value[0] > 0u) {" NL
			"    if (atomicXor(g_uint_out[gl_InvocationID], g_uint_value[5]) != 3u) return;" NL "  }" NL
			"  if (atomicCompSwap(g_uint_out[gl_InvocationID], g_uint_value[6], g_uint_value[7]) != 2u) {" NL
			"    g_uint_out[gl_InvocationID] = 1u;" NL "    return;" NL "  }" NL NL
			"  if (atomicAdd(g_int_out.data[gl_InvocationID], 3) != 0) return;" NL
			"  if (atomicExchange(g_int_out.data[gl_InvocationID], 3) != 3) return;" NL
			"  if (atomicMin(g_int_out.data[gl_InvocationID], 1) != 3) return;" NL
			"  if (atomicMax(g_int_out.data[gl_InvocationID], 2) != 1) return;" NL
			"  if (atomicAnd(g_int_out.data[gl_InvocationID], 0x1) != 2) return;" NL
			"  if (atomicOr(g_int_out.data[gl_InvocationID], 0x3) != 0) return;" NL
			"  if (atomicXor(g_int_out.data[gl_InvocationID], 0x1) != 3) return;" NL
			"  if (atomicCompSwap(g_int_out.data[gl_InvocationID], 0x2, 0x7) != 2) {" NL
			"    g_int_out.data[gl_InvocationID] = 1;" NL "    return;" NL "  }" NL "}";

		const char* const glsl_tes =
			NL "layout(quads, point_mode) in;" NL "layout(std430, binding = 2) buffer TESuint {" NL "  uint data[1];" NL
			   "} g_uint_tes;" NL "layout(std430, binding = 3) buffer TESint {" NL "  int data[1];" NL "} g_int_tes;" NL
			   "uniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);" NL "void main() {" NL
			   "  gl_Position = gl_in[0].gl_Position;" NL NL
			   "  if (atomicExchange(g_uint_tes.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;" NL
			   "  if (atomicAdd(g_uint_tes.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicMin(g_uint_tes.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;" NL
			   "  if (atomicMax(g_uint_tes.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicAnd(g_uint_tes.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;" NL
			   "  if (atomicOr(g_uint_tes.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;" NL
			   "  if (g_uint_value[0] > 0u) {" NL
			   "    if (atomicXor(g_uint_tes.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;" NL "  }" NL
			   "  if (atomicCompSwap(g_uint_tes.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {" NL
			   "    g_uint_tes.data[gl_PrimitiveID] = 1u;" NL "    return;" NL "  }" NL NL
			   "  if (atomicExchange(g_int_tes.data[gl_PrimitiveID], 1) != 0) return;" NL
			   "  if (atomicAdd(g_int_tes.data[gl_PrimitiveID], 2) != 1) return;" NL
			   "  if (atomicMin(g_int_tes.data[gl_PrimitiveID], 1) != 3) return;" NL
			   "  if (atomicMax(g_int_tes.data[gl_PrimitiveID], 2) != 1) return;" NL
			   "  if (atomicAnd(g_int_tes.data[gl_PrimitiveID], 0x1) != 2) return;" NL
			   "  if (atomicOr(g_int_tes.data[gl_PrimitiveID], 0x3) != 0) return;" NL
			   "  if (atomicXor(g_int_tes.data[gl_PrimitiveID], 0x1) != 3) return;" NL
			   "  if (atomicCompSwap(g_int_tes.data[gl_PrimitiveID], 0x2, 0x7) != 2) {" NL
			   "    g_int_tes.data[gl_PrimitiveID] = 1;" NL "    return;" NL "  }" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_tcs, glsl_tes, "", glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_storage_buffer);
		for (GLuint i = 0; i < 4; ++i)
		{
			const int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		/* vertex buffer */
		{
			const float data[2] = { 0.0f, 0.0f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		for (int ii = 0; ii < 2; ++ii)
		{
			/* uint data */
			{
				GLuint data[1];
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[ii * 2 + 0]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
				for (GLuint i = 0; i < 1; ++i)
				{
					if (data[i] != 7)
					{
						Output("uData at index %d is %d should be %d.\n", i, data[i], 7);
						return ERROR;
					}
				}
			}
			/* int data */
			{
				GLint data[1];
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[ii * 2 + 1]);
				glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
				for (GLint i = 0; i < 1; ++i)
				{
					if (data[i] != 7)
					{
						Output("iData at index %d is %d should be %d.\n", i, data[i], 7);
						return ERROR;
					}
				}
			}
		}
		return NO_ERROR;
	}